

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall ON_3fVector::Unitize(ON_3fVector *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  
  uVar2 = this->x;
  uVar3 = this->y;
  fVar1 = this->z;
  dVar5 = ON_Length3d((double)(float)uVar2,(double)(float)uVar3,(double)fVar1);
  if (0.0 < dVar5) {
    auVar4._8_8_ = (double)(float)uVar3;
    auVar4._0_8_ = (double)(float)uVar2;
    auVar6._8_4_ = SUB84(dVar5,0);
    auVar6._0_8_ = dVar5;
    auVar6._12_4_ = (int)((ulong)dVar5 >> 0x20);
    auVar6 = divpd(auVar4,auVar6);
    this->x = (float)auVar6._0_8_;
    this->y = (float)auVar6._8_8_;
    this->z = (float)((double)fVar1 / dVar5);
  }
  return 0.0 < dVar5;
}

Assistant:

bool ON_3fVector::Unitize()
{
  bool rc = false;
  // Since x,y,z are floats, d will not be denormalized and the
  // ON_DBL_MIN tests in ON_2dVector::Unitize() are not needed.
  double d = Length();
  if ( d > 0.0 ) 
  {
    double dx = x;
    double dy = y;
    double dz = z;
    x = (float)(dx/d);
    y = (float)(dy/d);
    z = (float)(dz/d);
    rc = true;
  }
  return rc;
}